

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_aflr_volume(REF_GRID ref_grid,char *project,char *options)

{
  REF_NODE pRVar1;
  int iVar2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT nnode_surface;
  int system_status;
  char command [1024];
  char filename [1024];
  REF_NODE ref_node;
  char *options_local;
  char *project_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  printf("%d surface nodes %d triangles\n",(ulong)(uint)pRVar1->n,(ulong)(uint)ref_grid->cell[3]->n)
  ;
  snprintf(command + 0x3f8,0x400,"%s-aflr-surface.lb8.ugrid",project);
  ref_grid_local._4_4_ = ref_export_by_extension(ref_grid,command + 0x3f8);
  if (ref_grid_local._4_4_ == 0) {
    if (options == (char *)0x0) {
      snprintf((char *)&nnode_surface,0x400,
               "aflr3 -igrid %s-aflr-surface.lb8.ugrid -ogrid %s-aflr-volume.ugrid -mrecrbf=0 -angqbf=179.9 -angqbfmin=0.1 < /dev/null > %s-aflr.txt"
               ,project,project,project);
    }
    else {
      snprintf((char *)&nnode_surface,0x400,
               "aflr3 -igrid %s-aflr-surface.lb8.ugrid -ogrid %s-aflr-volume.ugrid %s < /dev/null > %s-aflr.txt"
               ,project,project,options,project);
    }
    printf("%s\n",&nnode_surface);
    fflush(_stdout);
    iVar2 = system((char *)&nnode_surface);
    if ((long)iVar2 == 0) {
      iVar2 = pRVar1->n;
      snprintf(command + 0x3f8,0x400,"%s-aflr-volume.ugrid",project);
      ref_grid_local._4_4_ = ref_import_ugrid_tets(ref_grid,command + 0x3f8);
      if (ref_grid_local._4_4_ == 0) {
        printf("%d interior nodes\n",(ulong)(uint)(pRVar1->n - iVar2));
        ref_grid->surf = 0;
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x993,"ref_geom_aflr_volume",(ulong)ref_grid_local._4_4_,"tets only");
      }
    }
    else {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x98e,
             "ref_geom_aflr_volume","aflr failed",0,(long)iVar2);
      ref_grid_local._4_4_ = 1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x97b,
           "ref_geom_aflr_volume",(ulong)ref_grid_local._4_4_,"ugrid");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_aflr_volume(REF_GRID ref_grid, const char *project,
                                        const char *options) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  char filename[1024];
  char command[1024];
  int system_status;
  REF_INT nnode_surface;

  printf("%d surface nodes %d triangles\n", ref_node_n(ref_node),
         ref_cell_n(ref_grid_tri(ref_grid)));

  snprintf(filename, 1024, "%s-aflr-surface.lb8.ugrid", project);
  RSS(ref_export_by_extension(ref_grid, filename), "ugrid");
  if (NULL == options) {
    snprintf(
        command, 1024,
        "aflr3 -igrid %s-aflr-surface.lb8.ugrid -ogrid %s-aflr-volume.ugrid "
        "-mrecrbf=0 -angqbf=179.9 -angqbfmin=0.1 "
        "< /dev/null > %s-aflr.txt",
        project, project, project);
  } else {
    snprintf(
        command, 1024,
        "aflr3 -igrid %s-aflr-surface.lb8.ugrid -ogrid %s-aflr-volume.ugrid "
        "%s "
        "< /dev/null > %s-aflr.txt",
        project, project, options, project);
  }
  printf("%s\n", command);
  fflush(stdout);
  system_status = system(command);
  REIS(0, system_status, "aflr failed");

  nnode_surface = ref_node_n(ref_node);

  snprintf(filename, 1024, "%s-aflr-volume.ugrid", project);
  RSS(ref_import_ugrid_tets(ref_grid, filename), "tets only");

  printf("%d interior nodes\n", ref_node_n(ref_node) - nnode_surface);

  ref_grid_surf(ref_grid) = REF_FALSE;

  return REF_SUCCESS;
}